

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O1

bool __thiscall
GmmLib::GmmResourceInfoCommon::IsMipRCCAligned(GmmResourceInfoCommon *this,uint8_t *MisAlignedLod)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  
  (*this->_vptr_GmmResourceInfoCommon[0x2a])();
  uVar3 = 0;
  uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x16])(this,0);
  bVar4 = false;
  bVar2 = 0;
  if ((uVar1 & 0x1f) == 0) {
    bVar2 = 0;
    bVar4 = false;
    do {
      uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x17])(this,uVar3);
      if ((uVar1 & 3) != 0) break;
      bVar2 = bVar2 + 1;
      uVar3 = (ulong)bVar2;
      uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x2a])(this);
      bVar4 = (uVar1 & 0xff) < (uint)bVar2;
      if (bVar4) {
        return bVar4;
      }
      uVar1 = (*this->_vptr_GmmResourceInfoCommon[0x16])(this,(ulong)(uint)bVar2);
    } while ((uVar1 & 0x1f) == 0);
  }
  *MisAlignedLod = bVar2;
  return bVar4;
}

Assistant:

bool GMM_STDCALL GmmLib::GmmResourceInfoCommon::IsMipRCCAligned(uint8_t &MisAlignedLod)
{
    const uint8_t RCCCachelineWidth  = 32;
    const uint8_t RCCCachelineHeight = 4;

    for(uint8_t lod = 0; lod <= ((uint8_t)GetMaxLod()); lod++)
    {
        if(!(GFX_IS_ALIGNED(GetMipWidth(lod), RCCCachelineWidth) &&
             GFX_IS_ALIGNED(GetMipHeight(lod), RCCCachelineHeight)))
        {
            MisAlignedLod = lod;
            return false;
        }
    }
    return true;
}